

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_primitives.cpp
# Opt level: O3

string * __thiscall
editor::figures::Rectangle::get_representation_abi_cxx11_
          (string *__return_storage_ptr__,Rectangle *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"rectangle, left top: (",0x16);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(this->left_top).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->left_top).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), right bottom: (",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->right_bottom).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->right_bottom).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Rectangle::get_representation() {
        std::stringstream ss;
        ss << "rectangle, left top: ("
                  << left_top.x << "," << left_top.y << "), right bottom: ("
                  << right_bottom.x << "," << right_bottom.y << ")";
        return ss.str();
    }